

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.h
# Opt level: O1

bool __thiscall FsmMachineClass::operator<(FsmMachineClass *this,FsmMachineClass *fsmc)

{
  unsigned_short *puVar1;
  unsigned_short *puVar2;
  pointer puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  bool bVar9;
  
  if (this == fsmc) {
    return false;
  }
  puVar1 = (this->m_wGlyphs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->m_wGlyphs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (long)puVar2 - (long)puVar1 >> 1;
  puVar3 = (fsmc->m_wGlyphs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(fsmc->m_wGlyphs).
                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar3 >> 1;
  if (uVar5 != uVar6) {
    return uVar5 < uVar6;
  }
  bVar9 = puVar2 != puVar1;
  if (bVar9) {
    uVar7 = *puVar1;
    uVar8 = *puVar3;
    if (uVar7 == uVar8) {
      uVar6 = 1;
      do {
        uVar4 = uVar6;
        if (uVar5 + (uVar5 == 0) == uVar4) {
          bVar9 = uVar4 < uVar5;
          goto LAB_00148674;
        }
        uVar7 = puVar1[uVar4];
        uVar8 = puVar3[uVar4];
        uVar6 = uVar4 + 1;
      } while (uVar7 == uVar8);
      bVar9 = uVar4 < uVar5;
    }
    uVar5 = (ulong)(uVar7 < uVar8);
  }
LAB_00148674:
  return (bool)(bVar9 & (byte)uVar5);
}

Assistant:

bool operator<(const FsmMachineClass & fsmc) const
	{
		if (this == &fsmc)
			return false; // equal, not less than
		if (this->m_wGlyphs.size() != fsmc.m_wGlyphs.size())
			return (this->m_wGlyphs.size() < fsmc.m_wGlyphs.size());
		for (size_t iw = 0; iw < m_wGlyphs.size(); iw++)
		{
			if (this->m_wGlyphs[iw] != fsmc.m_wGlyphs[iw])
				return (this->m_wGlyphs[iw] < fsmc.m_wGlyphs[iw]);
		}
		return false; // equal, not less than
	}